

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O0

int arkCheckConvergence(ARKodeMem ark_mem,int *nflagPtr,int *ncfPtr)

{
  ARKodeHAdaptMem pAVar1;
  int *in_RDX;
  int *in_RSI;
  ARKodeMem in_RDI;
  ARKodeHAdaptMem hadapt_mem;
  int local_4;
  
  if (*in_RSI == 0) {
    local_4 = 0;
  }
  else {
    in_RDI->ncfn = in_RDI->ncfn + 1;
    if (in_RDI->fixedstep == 0) {
      if (in_RDI->hadapt_mem == (ARKodeHAdaptMem)0x0) {
        arkProcessError(in_RDI,-0x15,0xbc0,"arkCheckConvergence",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                        ,"Adaptivity memory structure not allocated.");
        local_4 = -0x15;
      }
      else {
        pAVar1 = in_RDI->hadapt_mem;
        if (*in_RSI < 0) {
          if (*in_RSI == -6) {
            local_4 = -6;
          }
          else if (*in_RSI == -7) {
            local_4 = -7;
          }
          else if (*in_RSI == -8) {
            local_4 = -8;
          }
          else {
            local_4 = -0x20;
          }
        }
        else {
          *in_RDX = *in_RDX + 1;
          pAVar1->etamax = 1.0;
          if ((*in_RDX == in_RDI->maxncf) || (ABS(in_RDI->h) <= in_RDI->hmin * 1.000001)) {
            if (*in_RSI == 4) {
              return -4;
            }
            if (*in_RSI == 9) {
              return -10;
            }
          }
          in_RDI->eta = pAVar1->etacf;
          *in_RSI = 7;
          local_4 = 3;
        }
      }
    }
    else {
      local_4 = -4;
    }
  }
  return local_4;
}

Assistant:

int arkCheckConvergence(ARKodeMem ark_mem, int* nflagPtr, int* ncfPtr)
{
  ARKodeHAdaptMem hadapt_mem;

  if (*nflagPtr == ARK_SUCCESS) { return (ARK_SUCCESS); }

  /* The nonlinear soln. failed; increment ncfn */
  ark_mem->ncfn++;

  /* If fixed time stepping, then return with convergence failure */
  if (ark_mem->fixedstep) { return (ARK_CONV_FAILURE); }

  /* Otherwise, access adaptivity structure */
  if (ark_mem->hadapt_mem == NULL)
  {
    arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARKADAPT_NO_MEM);
    return (ARK_MEM_NULL);
  }
  hadapt_mem = ark_mem->hadapt_mem;

  /* Return if lsetup, lsolve, or rhs failed unrecoverably */
  if (*nflagPtr < 0)
  {
    if (*nflagPtr == ARK_LSETUP_FAIL) { return (ARK_LSETUP_FAIL); }
    else if (*nflagPtr == ARK_LSOLVE_FAIL) { return (ARK_LSOLVE_FAIL); }
    else if (*nflagPtr == ARK_RHSFUNC_FAIL) { return (ARK_RHSFUNC_FAIL); }
    else { return (ARK_NLS_OP_ERR); }
  }

  /* At this point, nflag = CONV_FAIL or RHSFUNC_RECVR; increment ncf */
  (*ncfPtr)++;
  hadapt_mem->etamax = ONE;

  /* If we had maxncf failures, or if |h| = hmin,
     return ARK_CONV_FAILURE or ARK_REPTD_RHSFUNC_ERR. */
  if ((*ncfPtr == ark_mem->maxncf) ||
      (SUNRabs(ark_mem->h) <= ark_mem->hmin * ONEPSM))
  {
    if (*nflagPtr == CONV_FAIL) { return (ARK_CONV_FAILURE); }
    if (*nflagPtr == RHSFUNC_RECVR) { return (ARK_REPTD_RHSFUNC_ERR); }
  }

  /* Reduce step size due to convergence failure */
  ark_mem->eta = hadapt_mem->etacf;

  /* Signal for Jacobian/preconditioner setup */
  *nflagPtr = PREV_CONV_FAIL;

  /* Return to reattempt the step */
  return (PREDICT_AGAIN);
}